

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

IterateResult __thiscall gl3cts::ClipDistance::CoverageTest::iterate(CoverageTest *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  bool local_75;
  bool local_74;
  bool local_73;
  bool local_72;
  bool is_ok;
  allocator<char> local_41;
  string local_40;
  ApiType local_20;
  ContextType local_1c;
  Functions *local_18;
  Functions *gl;
  CoverageTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  local_18 = (Functions *)CONCAT44(extraout_var,iVar2);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  local_1c.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  glu::ApiType::ApiType(&local_20,3,0,PROFILE_CORE);
  bVar1 = glu::contextSupports(local_1c,local_20);
  if (bVar1) {
    bVar1 = MaxClipDistancesValueTest(this,local_18);
    local_72 = false;
    if (bVar1) {
      local_72 = EnableDisableTest(this,local_18);
    }
    local_73 = false;
    if (local_72 != false) {
      local_73 = MaxClipDistancesValueInVertexShaderTest(this,local_18);
    }
    local_74 = false;
    if (local_73 != false) {
      local_74 = MaxClipDistancesValueInFragmentShaderTest(this,local_18);
    }
    local_75 = false;
    if (local_74 != false) {
      local_75 = ClipDistancesValuePassing(this,local_18);
    }
    if (local_75 == false) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"GL_ARB_clip_distance is not supported",&local_41);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestNode::IterateResult gl3cts::ClipDistance::CoverageTest::iterate()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* This test should only be executed if we're running a GL3.0 context */
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType(3, 0, glu::PROFILE_CORE)))
	{
		throw tcu::NotSupportedError("GL_ARB_clip_distance is not supported");
	}

	/* Running tests. */
	bool is_ok = true;

	is_ok = is_ok && MaxClipDistancesValueTest(gl);
	is_ok = is_ok && EnableDisableTest(gl);
	is_ok = is_ok && MaxClipDistancesValueInVertexShaderTest(gl);
	is_ok = is_ok && MaxClipDistancesValueInFragmentShaderTest(gl);
	is_ok = is_ok && ClipDistancesValuePassing(gl);

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}